

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

void fmt::print(FILE *f,CStringRef format_str,ArgList args)

{
  BasicMemoryWriter<char,_std::allocator<char>_> *this;
  size_t __size;
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  FILE *in_RDI;
  MemoryWriter w;
  BasicWriter<char> *in_stack_fffffffffffffd70;
  allocator<char> *in_stack_fffffffffffffd88;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  allocator<char> local_249;
  BasicWriter<char> local_248 [34];
  FILE *local_20;
  void *local_18;
  size_t sStack_10;
  int local_8;
  
  local_20 = in_RDI;
  local_18 = in_RDX;
  sStack_10 = in_RCX;
  local_8 = in_ESI;
  std::allocator<char>::allocator();
  BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  std::allocator<char>::~allocator(&local_249);
  BasicWriter<char>::write(local_248,local_8,local_18,sStack_10);
  this = (BasicMemoryWriter<char,_std::allocator<char>_> *)
         BasicWriter<char>::data(in_stack_fffffffffffffd70);
  __size = BasicWriter<char>::size((BasicWriter<char> *)0x1814e2);
  fwrite(this,__size,1,local_20);
  BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(this);
  return;
}

Assistant:

FMT_FUNC void fmt::print(std::FILE *f, CStringRef format_str, ArgList args) {
  MemoryWriter w;
  w.write(format_str, args);
  std::fwrite(w.data(), w.size(), 1, f);
}